

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearray.cpp
# Opt level: O2

QByteArray * __thiscall QByteArray::insert(QByteArray *this,qsizetype i,qsizetype count,char ch)

{
  long lVar1;
  
  if (0 < count && -1 < i) {
    lVar1 = (this->d).size;
    if (i < lVar1) {
      QtPrivate::QPodArrayOps<char>::insert((QPodArrayOps<char> *)this,i,count,ch);
    }
    else {
      QArrayDataPointer<char>::detachAndGrow
                (&this->d,GrowsAtEnd,(count + i) - lVar1,(char **)0x0,(QArrayDataPointer<char> *)0x0
                );
      if ((this->d).ptr == (char *)0x0) {
        qBadAlloc();
      }
      QtPrivate::QPodArrayOps<char>::copyAppend((QPodArrayOps<char> *)this,i - (this->d).size,' ');
      QtPrivate::QPodArrayOps<char>::copyAppend((QPodArrayOps<char> *)this,count,ch);
    }
    (this->d).ptr[(this->d).size] = '\0';
  }
  return this;
}

Assistant:

QByteArray &QByteArray::insert(qsizetype i, qsizetype count, char ch)
{
    if (i < 0 || count <= 0)
        return *this;

    if (i >= d->size) {
        // handle this specially, as QArrayDataOps::insert() doesn't handle out of bounds positions
        d.detachAndGrow(Data::GrowsAtEnd, (i - d.size) + count, nullptr, nullptr);
        Q_CHECK_PTR(d.data());
        d->copyAppend(i - d->size, ' ');
        d->copyAppend(count, ch);
        d.data()[d.size] = '\0';
        return *this;
    }

    d->insert(i, count, ch);
    d.data()[d.size] = '\0';
    return *this;
}